

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  char *__end;
  char *pcVar1;
  CommentInfo *__end_00;
  undefined8 uVar2;
  Value local_160;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_c9;
  string local_c8 [8];
  string buffer_1;
  Char buffer [33];
  char format [4];
  size_t ulength;
  allocator local_61;
  string local_60;
  size_t local_40;
  ptrdiff_t length;
  int count;
  int bufferSize;
  double value;
  Value *decoded_local;
  Token *token_local;
  OurReader *this_local;
  
  _count = 0.0;
  length._4_4_ = 0x20;
  register0x00000000 = (long)token->end_ - (long)token->start_;
  local_40 = register0x00000000;
  value = (double)decoded;
  decoded_local = (Value *)token;
  token_local = (Token *)this;
  if ((long)register0x00000000 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"Unable to parse token length",&local_61);
    this_local._7_1_ = addError(this,&local_60,(Token *)decoded_local,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else {
    builtin_memcpy(buffer + 0x1c,"%lf",4);
    if ((long)register0x00000000 < 0x21) {
      memcpy((void *)((long)&buffer_1.field_2 + 8),token->start_,register0x00000000);
      buffer[local_40 - 8] = '\0';
      fixNumericLocaleInput(buffer_1.field_2._M_local_buf + 8,buffer + (local_40 - 8));
      length._0_4_ = __isoc99_sscanf((undefined1 *)((long)&buffer_1.field_2 + 8),buffer + 0x1c,
                                     &count);
    }
    else {
      pcVar1 = token->start_;
      __end = token->end_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>(local_c8,pcVar1,__end,&local_c9);
      std::allocator<char>::~allocator(&local_c9);
      uVar2 = std::__cxx11::string::c_str();
      length._0_4_ = __isoc99_sscanf(uVar2,buffer + 0x1c,&count);
      std::__cxx11::string::~string(local_c8);
    }
    if ((int)length == 1) {
      Value::Value(&local_160,_count);
      Value::operator=((Value *)value,&local_160);
      Value::~Value(&local_160);
      this_local._7_1_ = 1;
    }
    else {
      pcVar1 = *(char **)&decoded_local->field_0x8;
      __end_00 = decoded_local->comments_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((string *)&local_130,pcVar1,(char *)__end_00,&local_131);
      std::operator+(&local_110,"\'",&local_130);
      std::operator+(&local_f0,&local_110,"\' is not a number.");
      this_local._7_1_ = addError(this,&local_f0,(Token *)decoded_local,(Location)0x0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  ptrdiff_t const length = token.end_ - token.start_;

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }
  size_t const ulength = static_cast<size_t>(length);

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, ulength);
    buffer[length] = 0;
    fixNumericLocaleInput(buffer, buffer + length);
    count = sscanf(buffer, format, &value);
  } else {
    JSONCPP_STRING buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError("'" + JSONCPP_STRING(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}